

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

from_chars_result __thiscall
semver::detail::parse<long,long,long>(detail *this,string_view str,version<long,_long,_long> *out)

{
  string_view text;
  bool bVar1;
  char *ptr;
  char *ptr_00;
  token_stream *this_00;
  from_chars_result fVar2;
  version_parser local_a8;
  char *local_a0;
  errc local_98;
  undefined4 uStack_94;
  undefined4 local_8c;
  detail *local_88;
  char *local_80;
  lexer local_78;
  undefined1 local_60 [8];
  from_chars_result result;
  token_stream token_stream;
  version<long,_long,_long> *out_local;
  string_view str_local;
  errc local_10;
  
  detail::token_stream::token_stream((token_stream *)&result.super_from_chars_result.ec);
  text._M_str = (char *)str._M_len;
  text._M_len = (size_t)this;
  local_88 = this;
  local_80 = (char *)str._M_len;
  lexer::lexer(&local_78,text);
  fVar2 = lexer::scan_tokens(&local_78,(token_stream *)&result.super_from_chars_result.ec);
  local_60 = (undefined1  [8])fVar2.super_from_chars_result.ptr;
  result.super_from_chars_result.ptr =
       (char *)CONCAT44(result.super_from_chars_result.ptr._4_4_,fVar2.super_from_chars_result.ec);
  bVar1 = from_chars_result::operator_cast_to_bool((from_chars_result *)local_60);
  if (bVar1) {
    version_parser::version_parser(&local_a8,(token_stream *)&result.super_from_chars_result.ec);
    fVar2 = version_parser::parse<long,long,long>(&local_a8,(version<long,_long,_long> *)str._M_str)
    ;
    local_a0 = fVar2.super_from_chars_result.ptr;
    local_98 = fVar2.super_from_chars_result.ec;
    result.super_from_chars_result.ptr = (char *)CONCAT44(uStack_94,local_98);
    local_60 = (undefined1  [8])local_a0;
    bVar1 = from_chars_result::operator_cast_to_bool((from_chars_result *)local_60);
    if (bVar1) {
      this_00 = (token_stream *)0x0;
      bVar1 = detail::token_stream::consume((token_stream *)&result.super_from_chars_result.ec,eol);
      if (bVar1) {
        detail::token_stream::previous((token *)&result.super_from_chars_result.ec,this_00);
        fVar2 = success(ptr_00);
        str_local._M_str = fVar2.super_from_chars_result.ptr;
        local_10 = fVar2.super_from_chars_result.ec;
      }
      else {
        detail::token_stream::previous((token *)&result.super_from_chars_result.ec,this_00);
        fVar2 = failure(ptr,invalid_argument);
        str_local._M_str = fVar2.super_from_chars_result.ptr;
        local_10 = fVar2.super_from_chars_result.ec;
      }
    }
    else {
      str_local._M_str = (char *)local_60;
      local_10 = (errc)result.super_from_chars_result.ptr;
    }
  }
  else {
    str_local._M_str = (char *)local_60;
    local_10 = (errc)result.super_from_chars_result.ptr;
  }
  local_8c = 1;
  detail::token_stream::~token_stream((token_stream *)&result.super_from_chars_result.ec);
  fVar2.super_from_chars_result.ec = local_10;
  fVar2.super_from_chars_result.ptr = str_local._M_str;
  fVar2.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar2.super_from_chars_result;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse(std::string_view str, version<I1, I2, I3>& out) {
  token_stream token_stream;
  from_chars_result result = lexer{ str }.scan_tokens(token_stream);
  if (!result) {
    return result;
  }

  result = version_parser{ token_stream }.parse(out);
  if (!result) {
    return result;
  }

  if (!token_stream.consume(token_type::eol)) {
    return failure(token_stream.previous().lexeme);
  }

  return success(token_stream.previous().lexeme);
}